

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::Detach(ConsumerEndpointImpl *this,string *key)

{
  TaskRunner *pTVar1;
  anon_class_24_2_d4313ede local_68;
  function<void_()> local_50;
  undefined1 local_30 [8];
  WeakPtr<perfetto::TracingServiceImpl::ConsumerEndpointImpl> weak_this;
  bool success;
  string *key_local;
  ConsumerEndpointImpl *this_local;
  
  weak_this.handle_.
  super___shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._7_1_ = DetachConsumer(this->service_,this,key);
  perfetto::base::WeakPtrFactory<perfetto::TracingServiceImpl::ConsumerEndpointImpl>::GetWeakPtr
            ((WeakPtrFactory<perfetto::TracingServiceImpl::ConsumerEndpointImpl> *)local_30);
  pTVar1 = this->task_runner_;
  perfetto::base::WeakPtr<perfetto::TracingServiceImpl::ConsumerEndpointImpl>::WeakPtr
            (&local_68.weak_this,
             (WeakPtr<perfetto::TracingServiceImpl::ConsumerEndpointImpl> *)local_30);
  local_68.success =
       (bool)(weak_this.handle_.
              super___shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi._7_1_ & 1);
  ::std::function<void()>::
  function<perfetto::TracingServiceImpl::ConsumerEndpointImpl::Detach(std::__cxx11::string_const&)::__0,void>
            ((function<void()> *)&local_50,&local_68);
  (*pTVar1->_vptr_TaskRunner[2])(pTVar1,&local_50);
  ::std::function<void_()>::~function(&local_50);
  Detach(std::__cxx11::string_const&)::$_0::~__0((__0 *)&local_68);
  perfetto::base::WeakPtr<perfetto::TracingServiceImpl::ConsumerEndpointImpl>::~WeakPtr
            ((WeakPtr<perfetto::TracingServiceImpl::ConsumerEndpointImpl> *)local_30);
  return;
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::Detach(const std::string& key) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  bool success = service_->DetachConsumer(this, key);
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner_->PostTask([weak_this, success] {
    if (weak_this)
      weak_this->consumer_->OnDetach(success);
  });
}